

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

void __thiscall Diligent::ThreadPoolImpl::StopThreads(ThreadPoolImpl *this)

{
  bool bVar1;
  thread *worker;
  iterator __end2;
  iterator __begin2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  unique_lock<std::mutex> lock;
  ThreadPoolImpl *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&__range2,&this->m_TasksQueueMtx);
  std::atomic<bool>::store(&this->m_Stop,true,memory_order_seq_cst);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&__range2);
  std::condition_variable::notify_all();
  __end2 = std::vector<std::thread,_std::allocator<std::thread>_>::begin(&this->m_WorkerThreads);
  worker = (thread *)
           std::vector<std::thread,_std::allocator<std::thread>_>::end(&this->m_WorkerThreads);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                *)&worker);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end2);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end2);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::clear(&this->m_WorkerThreads);
  return;
}

Assistant:

StopThreads() override final
    {
        {
            std::unique_lock<std::mutex> lock{m_TasksQueueMtx};
            // NB: even if the shared variable is atomic, it must be modified under the mutex
            //     in order to correctly publish the modification to the waiting thread.
            m_Stop.store(true);
        }
        // Note that if there are outstanding tasks in the queue, the threads may be woken up
        // by the corresponding notify_one() as notify*() and wait*() take place in a single
        // total order.
        m_NextTaskCond.notify_all();
        for (std::thread& worker : m_WorkerThreads)
            worker.join();

        m_WorkerThreads.clear();
    }